

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_seg_t * ps_lattice_seg_iter(ps_lattice_t *dag,ps_latlink_t *link,float32 lwf)

{
  ps_latnode_t *ppVar1;
  int local_3c;
  ps_latlink_s *ppStack_38;
  int cur;
  ps_latlink_t *l;
  dag_seg_t *itor;
  float32 lwf_local;
  ps_latlink_t *link_local;
  ps_lattice_t *dag_local;
  
  dag_local = (ps_lattice_t *)
              __ckd_calloc__(1,0x48,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                             ,0x3f8);
  *(ps_segfuncs_t **)dag_local = &ps_lattice_segfuncs;
  dag_local->lmath = (logmath_t *)dag->search;
  *(float32 *)((long)&dag_local->start + 4) = lwf;
  *(undefined2 *)&dag_local->n_nodes = 0;
  dag_local->n_frames = dag->norm;
  for (ppStack_38 = link; ppStack_38 != (ps_latlink_t *)0x0; ppStack_38 = ppStack_38->best_prev) {
    *(short *)&dag_local->n_nodes = (short)dag_local->n_nodes + 1;
  }
  if ((short)dag_local->n_nodes == 0) {
    ckd_free(dag_local);
    dag_local = (ps_lattice_t *)0x0;
  }
  else {
    ppVar1 = (ps_latnode_t *)
             __ckd_calloc__((long)(short)dag_local->n_nodes,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x407);
    dag_local->end = ppVar1;
    local_3c = (int)(short)dag_local->n_nodes;
    for (ppStack_38 = link; local_3c = local_3c + -1, ppStack_38 != (ps_latlink_t *)0x0;
        ppStack_38 = ppStack_38->best_prev) {
      *(ps_latlink_s **)(&dag_local->end->id + (long)local_3c * 2) = ppStack_38;
    }
    ps_lattice_link2itor((ps_seg_t *)dag_local,*(ps_latlink_t **)dag_local->end,0);
  }
  return (ps_seg_t *)dag_local;
}

Assistant:

ps_seg_t *
ps_lattice_seg_iter(ps_lattice_t *dag, ps_latlink_t *link, float32 lwf)
{
    dag_seg_t *itor;
    ps_latlink_t *l;
    int cur;

    /* Calling this an "iterator" is a bit of a misnomer since we have
     * to get the entire backtrace in order to produce it.
     */
    itor = ckd_calloc(1, sizeof(*itor));
    itor->base.vt = &ps_lattice_segfuncs;
    itor->base.search = dag->search;
    itor->base.lwf = lwf;
    itor->n_links = 0;
    itor->norm = dag->norm;

    for (l = link; l; l = l->best_prev) {
        ++itor->n_links;
    }
    if (itor->n_links == 0) {
        ckd_free(itor);
        return NULL;
    }

    itor->links = ckd_calloc(itor->n_links, sizeof(*itor->links));
    cur = itor->n_links - 1;
    for (l = link; l; l = l->best_prev) {
        itor->links[cur] = l;
        --cur;
    }

    ps_lattice_link2itor((ps_seg_t *)itor, itor->links[0], FALSE);
    return (ps_seg_t *)itor;
}